

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall icu_63::DecimalFormat::setupFastFormat(DecimalFormat *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  DecimalFormatSymbols *pDVar6;
  bool bVar7;
  int8_t iVar8;
  char16_t cVar9;
  int iVar10;
  DecimalFormatFields *pDVar11;
  int iVar12;
  DecimalFormatProperties *pDVar13;
  int iVar14;
  
  bVar7 = icu_63::number::impl::DecimalFormatProperties::equalsDefaultExceptFastFormat
                    ((this->fields->properties).
                     super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr);
  pDVar11 = this->fields;
  if (bVar7) {
    pDVar13 = (pDVar11->properties).
              super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
    uVar1 = (pDVar13->negativePrefixPattern).fUnion.fStackFields.fLengthAndFlags;
    uVar2 = (pDVar13->positivePrefixPattern).fUnion.fStackFields.fLengthAndFlags;
    uVar3 = (pDVar13->positiveSuffixPattern).fUnion.fStackFields.fLengthAndFlags;
    bVar7 = true;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar10 = (pDVar13->negativePrefixPattern).fUnion.fFields.fLength;
      }
      else {
        iVar10 = (int)(short)uVar1 >> 5;
      }
      if (iVar10 == 1) {
        cVar9 = UnicodeString::doCharAt(&pDVar13->negativePrefixPattern,0);
        bVar7 = cVar9 == L'-';
        pDVar11 = this->fields;
        pDVar13 = (pDVar11->properties).
                  super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
      }
      else {
        bVar7 = false;
      }
    }
    if ((bVar7) &&
       ((ushort)(uVar3 | uVar2 |
                (pDVar13->negativeSuffixPattern).fUnion.fStackFields.fLengthAndFlags) < 0x20)) {
      bVar7 = pDVar13->groupingUsed;
      iVar10 = pDVar13->groupingSize;
      pDVar6 = (pDVar11->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr;
      if (bVar7 == true) {
        if (0 < iVar10 && iVar10 != 3) goto LAB_002438e8;
        if (*(short *)&pDVar6->field_0x50 < 0) {
          iVar12 = *(int *)&pDVar6->field_0x54;
        }
        else {
          iVar12 = (int)*(short *)&pDVar6->field_0x50 >> 5;
        }
        if (iVar12 != 1) goto LAB_002438e8;
      }
      pDVar13 = (pDVar11->exportedProperties).
                super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
      iVar12 = pDVar13->minimumIntegerDigits;
      if ((iVar12 < 0xb) && (pDVar13->minimumFractionDigits < 1)) {
        uVar4 = pDVar6->fCodePointZero;
        if (*(short *)&pDVar6->field_0x190 < 0) {
          iVar14 = *(int *)&pDVar6->field_0x194;
        }
        else {
          iVar14 = (int)*(short *)&pDVar6->field_0x190 >> 5;
        }
        if ((uVar4 < 0x10000) && (iVar14 == 1)) {
          uVar5 = pDVar13->maximumIntegerDigits;
          pDVar11->canUseFastFormat = true;
          (pDVar11->fastData).cpZero = (char16_t)uVar4;
          cVar9 = L'\0';
          if ((bVar7 & iVar10 == 3) == 1) {
            cVar9 = UnicodeString::doCharAt((UnicodeString *)&pDVar6->field_0x48,0);
            pDVar11 = this->fields;
          }
          (pDVar11->fastData).cpGroupingSeparator = cVar9;
          cVar9 = UnicodeString::doCharAt((UnicodeString *)&pDVar6->field_0x188,0);
          pDVar11 = this->fields;
          (pDVar11->fastData).cpMinusSign = cVar9;
          iVar10 = 0;
          if (0 < iVar12) {
            iVar10 = iVar12;
          }
          (pDVar11->fastData).minInt = (int8_t)iVar10;
          iVar8 = '\x7f';
          if (uVar5 < 0x7f) {
            iVar8 = (int8_t)uVar5;
          }
          (pDVar11->fastData).maxInt = iVar8;
          return;
        }
      }
    }
  }
LAB_002438e8:
  pDVar11->canUseFastFormat = false;
  return;
}

Assistant:

void DecimalFormat::setupFastFormat() {
    // Check the majority of properties:
    if (!fields->properties->equalsDefaultExceptFastFormat()) {
        trace("no fast format: equality\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Now check the remaining properties.
    // Nontrivial affixes:
    UBool trivialPP = fields->properties->positivePrefixPattern.isEmpty();
    UBool trivialPS = fields->properties->positiveSuffixPattern.isEmpty();
    UBool trivialNP = fields->properties->negativePrefixPattern.isBogus() || (
            fields->properties->negativePrefixPattern.length() == 1 &&
            fields->properties->negativePrefixPattern.charAt(0) == u'-');
    UBool trivialNS = fields->properties->negativeSuffixPattern.isEmpty();
    if (!trivialPP || !trivialPS || !trivialNP || !trivialNS) {
        trace("no fast format: affixes\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Grouping (secondary grouping is forbidden in equalsDefaultExceptFastFormat):
    bool groupingUsed = fields->properties->groupingUsed;
    int32_t groupingSize = fields->properties->groupingSize;
    bool unusualGroupingSize = groupingSize > 0 && groupingSize != 3;
    const UnicodeString& groupingString = fields->symbols->getConstSymbol(DecimalFormatSymbols::kGroupingSeparatorSymbol);
    if (groupingUsed && (unusualGroupingSize || groupingString.length() != 1)) {
        trace("no fast format: grouping\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Integer length:
    int32_t minInt = fields->exportedProperties->minimumIntegerDigits;
    int32_t maxInt = fields->exportedProperties->maximumIntegerDigits;
    // Fastpath supports up to only 10 digits (length of INT32_MIN)
    if (minInt > 10) {
        trace("no fast format: integer\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Fraction length (no fraction part allowed in fast path):
    int32_t minFrac = fields->exportedProperties->minimumFractionDigits;
    if (minFrac > 0) {
        trace("no fast format: fraction\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Other symbols:
    const UnicodeString& minusSignString = fields->symbols->getConstSymbol(DecimalFormatSymbols::kMinusSignSymbol);
    UChar32 codePointZero = fields->symbols->getCodePointZero();
    if (minusSignString.length() != 1 || U16_LENGTH(codePointZero) != 1) {
        trace("no fast format: symbols\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Good to go!
    trace("can use fast format!\n");
    fields->canUseFastFormat = true;
    fields->fastData.cpZero = static_cast<char16_t>(codePointZero);
    fields->fastData.cpGroupingSeparator = groupingUsed && groupingSize == 3 ? groupingString.charAt(0) : 0;
    fields->fastData.cpMinusSign = minusSignString.charAt(0);
    fields->fastData.minInt = (minInt < 0 || minInt > 127) ? 0 : static_cast<int8_t>(minInt);
    fields->fastData.maxInt = (maxInt < 0 || maxInt > 127) ? 127 : static_cast<int8_t>(maxInt);
}